

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  if (0x10 < this->limit_) {
    pcVar1 = NextBuffer<false>(this,0,-1);
    pcVar2 = this->buffer_end_;
    if (pcVar1 == (char *)0x0) {
      this->last_tag_minus_1_ = 1;
    }
    else {
      uVar3 = ((int)pcVar1 - (int)pcVar2) + this->limit_;
      this->limit_ = uVar3;
      pcVar2 = pcVar2 + (int)((int)uVar3 >> 0x1f & uVar3);
    }
    this->limit_end_ = pcVar2;
    return pcVar1;
  }
  Next((EpsCopyInputStream *)&stack0xffffffffffffffe8);
}

Assistant:

const char* EpsCopyInputStream::Next() {
  ABSL_DCHECK(limit_ > kSlopBytes);
  auto p = NextBuffer</*kExperimentalV2=*/false>(0 /* immaterial */, -1);
  if (p == nullptr) {
    limit_end_ = buffer_end_;
    // Distinguish ending on a pushed limit or ending on end-of-stream.
    SetEndOfStream();
    return nullptr;
  }
  limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return p;
}